

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForTorCorrFunc.cpp
# Opt level: O0

Mat3x3d * __thiscall
OpenMD::ForTorCorrFunc::calcCorrVal(ForTorCorrFunc *this,int frame1,int frame2,int id1,int id2)

{
  reference pvVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  Mat3x3d *in_RDI;
  int in_R8D;
  int in_R9D;
  
  pvVar1 = std::
           vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                         *)(in_RSI + 0xe40),(long)in_EDX);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            (pvVar1,(long)in_R8D);
  pvVar1 = std::
           vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                         *)(in_RSI + 0xe58),(long)in_ECX);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            (pvVar1,(long)in_R9D);
  outProduct<double>((Vector3<double> *)CONCAT44(in_EDX,in_ECX),
                     (Vector3<double> *)CONCAT44(in_R8D,in_R9D));
  return in_RDI;
}

Assistant:

Mat3x3d ForTorCorrFunc::calcCorrVal(int frame1, int frame2, int id1,
                                      int id2) {
    return outProduct(forces_[frame1][id1], torques_[frame2][id2]);
  }